

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O0

void SHA1Finalize(SHA1Context *context,uint8_t Pad_Byte)

{
  int local_18;
  int i;
  uint8_t Pad_Byte_local;
  SHA1Context *context_local;
  
  SHA1PadMessage(context,Pad_Byte);
  for (local_18 = 0; local_18 < 0x40; local_18 = local_18 + 1) {
    context->Message_Block[local_18] = '\0';
  }
  context->Length_Low = 0;
  context->Length_High = 0;
  context->Computed = 1;
  return;
}

Assistant:

static void SHA1Finalize(SHA1Context *context, uint8_t Pad_Byte)
{
    int i;
    SHA1PadMessage(context, Pad_Byte);
    /* message may be sensitive, clear it out */
    for (i = 0; i < SHA1_Message_Block_Size; ++i)
        context->Message_Block[i] = 0;
    context->Length_Low = 0;  /* and clear length */
    context->Length_High = 0;
    context->Computed = 1;
}